

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block.c
# Opt level: O0

void cdef_filter_block_internal
               (uint8_t *dst8,uint16_t *dst16,int dstride,uint16_t *in,int pri_strength,
               int sec_strength,int dir,int pri_damping,int sec_damping,int coeff_shift,
               int block_width,int block_height,int enable_primary,int enable_secondary)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_stack_00000008;
  byte in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  int16_t s3;
  int16_t s2;
  int16_t s1;
  int16_t s0;
  int16_t p1;
  int16_t p0;
  int min;
  int max;
  int16_t x;
  int16_t y;
  int16_t sum;
  int *sec_taps;
  int *pri_taps;
  int s;
  int k;
  int j;
  int i;
  int clipping_required;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int local_7c;
  bool local_6d;
  int local_60;
  int local_5c;
  short local_54;
  short local_52;
  int local_38;
  int local_34;
  int local_30;
  
  local_6d = in_stack_00000038 != 0 && in_stack_00000040 != 0;
  uVar6 = in_R8D >> (in_stack_00000020 & 0x1f) & 1;
  for (local_30 = 0; local_30 < in_stack_00000030; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < in_stack_00000028; local_34 = local_34 + 1) {
      local_52 = 0;
      local_54 = *(short *)(in_RCX + (long)(local_30 * 0x90 + local_34) * 2);
      local_5c = (int)local_54;
      local_60 = (int)local_54;
      for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
        if (in_stack_00000038 != 0) {
          sVar1 = *(short *)(in_RCX + (long)(local_30 * 0x90 + local_34 +
                                            *(int *)((long)in_stack_00000008 * 8 + 0xbca430 +
                                                    (long)local_38 * 4)) * 2);
          sVar2 = *(short *)(in_RCX + (long)((local_30 * 0x90 + local_34) -
                                            *(int *)((long)in_stack_00000008 * 8 + 0xbca430 +
                                                    (long)local_38 * 4)) * 2);
          iVar13 = cdef_pri_taps[(int)uVar6][local_38];
          iVar7 = constrain(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                            in_stack_ffffffffffffff78);
          iVar5 = cdef_pri_taps[(int)uVar6][local_38];
          iVar8 = constrain(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                            in_stack_ffffffffffffff78);
          local_52 = local_52 + (short)iVar13 * (short)iVar7 + (short)iVar5 * (short)iVar8;
          if (local_6d) {
            if (sVar1 != 0x4000) {
              if (local_5c < sVar1) {
                local_7c = (int)sVar1;
              }
              else {
                local_7c = local_5c;
              }
              local_5c = local_7c;
            }
            if ((sVar2 != 0x4000) && (in_stack_ffffffffffffff80 = local_5c, local_5c < sVar2)) {
              local_5c = (int)sVar2;
              in_stack_ffffffffffffff80 = local_5c;
            }
            if (sVar1 < local_60) {
              local_60 = (int)sVar1;
            }
            in_stack_ffffffffffffff78 = local_60;
            in_stack_ffffffffffffff7c = local_60;
            if (sVar2 < local_60) {
              in_stack_ffffffffffffff78 = (int)sVar2;
              local_60 = (int)sVar2;
            }
          }
        }
        if (in_stack_00000040 != 0) {
          sVar1 = *(short *)(in_RCX + (long)(local_30 * 0x90 + local_34 +
                                            *(int *)((long)(in_stack_00000008 + 2) * 8 + 0xbca430 +
                                                    (long)local_38 * 4)) * 2);
          sVar2 = *(short *)(in_RCX + (long)((local_30 * 0x90 + local_34) -
                                            *(int *)((long)(in_stack_00000008 + 2) * 8 + 0xbca430 +
                                                    (long)local_38 * 4)) * 2);
          sVar3 = *(short *)(in_RCX + (long)(local_30 * 0x90 + local_34 +
                                            *(int *)((long)(in_stack_00000008 + -2) * 8 + 0xbca430 +
                                                    (long)local_38 * 4)) * 2);
          sVar4 = *(short *)(in_RCX + (long)((local_30 * 0x90 + local_34) -
                                            *(int *)((long)(in_stack_00000008 + -2) * 8 + 0xbca430 +
                                                    (long)local_38 * 4)) * 2);
          if (local_6d) {
            if (sVar1 != 0x4000) {
              if (local_5c < sVar1) {
                local_8c = (int)sVar1;
              }
              else {
                local_8c = local_5c;
              }
              local_5c = local_8c;
            }
            if (sVar2 != 0x4000) {
              if (local_5c < sVar2) {
                local_90 = (int)sVar2;
              }
              else {
                local_90 = local_5c;
              }
              local_5c = local_90;
            }
            if (sVar3 != 0x4000) {
              if (local_5c < sVar3) {
                local_94 = (int)sVar3;
              }
              else {
                local_94 = local_5c;
              }
              local_5c = local_94;
            }
            if (sVar4 != 0x4000) {
              if (local_5c < sVar4) {
                local_98 = (int)sVar4;
              }
              else {
                local_98 = local_5c;
              }
              local_5c = local_98;
            }
            if (sVar1 < local_60) {
              local_9c = (int)sVar1;
            }
            else {
              local_9c = local_60;
            }
            if (sVar2 < local_9c) {
              local_a0 = (int)sVar2;
            }
            else {
              local_a0 = local_9c;
            }
            if (sVar3 < local_a0) {
              local_a4 = (int)sVar3;
            }
            else {
              local_a4 = local_a0;
            }
            if (sVar4 < local_a4) {
              local_a8 = (int)sVar4;
            }
            else {
              local_a8 = local_a4;
            }
            local_60 = local_a8;
          }
          iVar13 = cdef_sec_taps[local_38];
          iVar9 = constrain(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                            in_stack_ffffffffffffff78);
          iVar5 = cdef_sec_taps[local_38];
          iVar10 = constrain(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                             in_stack_ffffffffffffff78);
          iVar7 = cdef_sec_taps[local_38];
          iVar11 = constrain(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                             in_stack_ffffffffffffff78);
          iVar8 = cdef_sec_taps[local_38];
          iVar12 = constrain(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                             in_stack_ffffffffffffff78);
          local_52 = local_52 + (short)iVar13 * (short)iVar9 + (short)iVar5 * (short)iVar10 +
                     (short)iVar7 * (short)iVar11 + (short)iVar8 * (short)iVar12;
        }
      }
      local_54 = local_54 + (short)((int)((local_52 + 8) - (uint)(local_52 < 0)) >> 4);
      if (local_6d) {
        iVar13 = clamp((int)local_54,local_60,local_5c);
        local_54 = (short)iVar13;
      }
      if (in_RDI == 0) {
        *(short *)(in_RSI + (long)(local_30 * in_EDX + local_34) * 2) = local_54;
      }
      else {
        *(char *)(in_RDI + (local_30 * in_EDX + local_34)) = (char)local_54;
      }
    }
  }
  return;
}

Assistant:

static void cdef_filter_block_internal(
    uint8_t *dst8, uint16_t *dst16, int dstride, const uint16_t *in,
    int pri_strength, int sec_strength, int dir, int pri_damping,
    int sec_damping, int coeff_shift, int block_width, int block_height,
    int enable_primary, int enable_secondary) {
  const int clipping_required = (enable_primary && enable_secondary);
  int i, j, k;
  const int s = CDEF_BSTRIDE;
  const int *pri_taps = cdef_pri_taps[(pri_strength >> coeff_shift) & 1];
  const int *sec_taps = cdef_sec_taps;
  for (i = 0; i < block_height; i++) {
    for (j = 0; j < block_width; j++) {
      int16_t sum = 0;
      int16_t y;
      int16_t x = in[i * s + j];
      int max = x;
      int min = x;
      for (k = 0; k < 2; k++) {
        if (enable_primary) {
          int16_t p0 = in[i * s + j + cdef_directions[dir][k]];
          int16_t p1 = in[i * s + j - cdef_directions[dir][k]];
          sum += pri_taps[k] * constrain(p0 - x, pri_strength, pri_damping);
          sum += pri_taps[k] * constrain(p1 - x, pri_strength, pri_damping);
          if (clipping_required) {
            if (p0 != CDEF_VERY_LARGE) max = AOMMAX(p0, max);
            if (p1 != CDEF_VERY_LARGE) max = AOMMAX(p1, max);
            min = AOMMIN(p0, min);
            min = AOMMIN(p1, min);
          }
        }
        if (enable_secondary) {
          int16_t s0 = in[i * s + j + cdef_directions[dir + 2][k]];
          int16_t s1 = in[i * s + j - cdef_directions[dir + 2][k]];
          int16_t s2 = in[i * s + j + cdef_directions[dir - 2][k]];
          int16_t s3 = in[i * s + j - cdef_directions[dir - 2][k]];
          if (clipping_required) {
            if (s0 != CDEF_VERY_LARGE) max = AOMMAX(s0, max);
            if (s1 != CDEF_VERY_LARGE) max = AOMMAX(s1, max);
            if (s2 != CDEF_VERY_LARGE) max = AOMMAX(s2, max);
            if (s3 != CDEF_VERY_LARGE) max = AOMMAX(s3, max);
            min = AOMMIN(s0, min);
            min = AOMMIN(s1, min);
            min = AOMMIN(s2, min);
            min = AOMMIN(s3, min);
          }
          sum += sec_taps[k] * constrain(s0 - x, sec_strength, sec_damping);
          sum += sec_taps[k] * constrain(s1 - x, sec_strength, sec_damping);
          sum += sec_taps[k] * constrain(s2 - x, sec_strength, sec_damping);
          sum += sec_taps[k] * constrain(s3 - x, sec_strength, sec_damping);
        }
      }
      y = ((int16_t)x + ((8 + sum - (sum < 0)) >> 4));
      if (clipping_required) {
        y = clamp(y, min, max);
      }

      if (dst8)
        dst8[i * dstride + j] = (uint8_t)y;
      else
        dst16[i * dstride + j] = (uint16_t)y;
    }
  }
}